

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageOutput.cpp
# Opt level: O0

ImageOutput * __thiscall
ImageOutput::drawBoundary
          (ImageOutput *this,Mat *image,
          vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *boundary)

{
  bool bVar1;
  reference r;
  IReaderWriter *pIVar2;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *in_RCX;
  Rect_<int> local_120;
  Mat local_110 [96];
  Mat local_b0 [96];
  undefined1 local_50 [8];
  Rect_<int> bound;
  iterator __end1;
  iterator __begin1;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *__range1;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *boundary_local;
  Mat *image_local;
  ImageOutput *this_local;
  
  __end1 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::begin(in_RCX);
  bound._8_8_ = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::end(in_RCX);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                                *)&bound.width);
    if (!bVar1) break;
    r = __gnu_cxx::
        __normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
        ::operator*(&__end1);
    cv::Rect_<int>::Rect_((Rect_<int> *)local_50,r);
    pIVar2 = getWriter((ImageOutput *)image);
    cv::Mat::Mat(local_110,(Mat *)boundary);
    cv::Rect_<int>::Rect_(&local_120,(Rect_<int> *)local_50);
    (*pIVar2->_vptr_IReaderWriter[1])(local_b0,pIVar2,local_110,&local_120);
    cv::Mat::~Mat(local_b0);
    cv::Mat::~Mat(local_110);
    __gnu_cxx::
    __normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
    ::operator++(&__end1);
  }
  cv::Mat::Mat((Mat *)this,(Mat *)boundary);
  return this;
}

Assistant:

cv::Mat ImageOutput::drawBoundary(cv::Mat image,
                                  std::vector<cv::Rect> boundary) {
  for (auto bound : boundary) {  // in case of multiple boundaries
    getWriter()->drawRectangle(image, bound);  // call helper class
  }
  return image;
}